

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cave-square.c
# Opt level: O0

void square_sense_pile(chunk *c,loc_conflict grid,_func__Bool_object_ptr *pred)

{
  _Bool _Var1;
  object *local_28;
  object *obj;
  _func__Bool_object_ptr *pred_local;
  chunk *c_local;
  loc_conflict grid_local;
  
  if (c == (chunk *)cave) {
    for (local_28 = square_object(c,grid); local_28 != (object *)0x0; local_28 = local_28->next) {
      if ((pred == (_func__Bool_object_ptr *)0x0) || (_Var1 = (*pred)(local_28), _Var1)) {
        object_sense(player,local_28);
      }
    }
    forget_remembered_objects(c,(chunk *)player->cave,grid,pred);
  }
  return;
}

Assistant:

void square_sense_pile(struct chunk *c, struct loc grid,
		bool (*pred)(const struct object*))
{
	struct object *obj;

	if (c != cave) return;

	/* Sense the requested classes of items on this grid */
	for (obj = square_object(c, grid); obj; obj = obj->next) {
		if (!pred || (*pred)(obj)) {
			object_sense(player, obj);
		}
	}

	forget_remembered_objects(c, player->cave, grid, pred);
}